

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

void __thiscall
ON_RTree::SplitNode(ON_RTree *this,ON_RTreeNode *a_node,ON_RTreeBranch *a_branch,
                   ON_RTreeNode **a_newNode)

{
  int iVar1;
  ON_RTreeNode *pOVar2;
  undefined1 local_2a8 [4];
  int level;
  ON_RTreePartitionVars localVars;
  ON_RTreeNode **a_newNode_local;
  ON_RTreeBranch *a_branch_local;
  ON_RTreeNode *a_node_local;
  ON_RTree *this_local;
  
  iVar1 = a_node->m_level;
  localVars.m_coverSplitArea = (double)a_newNode;
  GetBranches(a_node,a_branch,(ON_RTreePartitionVars *)local_2a8);
  ChoosePartition((ON_RTreePartitionVars *)local_2a8,2);
  pOVar2 = ON_RTreeMemPool::AllocNode(&this->m_mem_pool);
  *(ON_RTreeNode **)localVars.m_coverSplitArea = pOVar2;
  a_node->m_level = iVar1;
  **(int **)localVars.m_coverSplitArea = iVar1;
  LoadNodes(this,a_node,*(ON_RTreeNode **)localVars.m_coverSplitArea,
            (ON_RTreePartitionVars *)local_2a8);
  return;
}

Assistant:

void ON_RTree::SplitNode(ON_RTreeNode* a_node, ON_RTreeBranch* a_branch, ON_RTreeNode** a_newNode)
{
  ON_RTreePartitionVars localVars;
  int level;

  // Load all the branches into a buffer, initialize a_node to be empty
  level = a_node->m_level; // save m_level (The InitNode() call in GetBranches will set it to -1)
  GetBranches(a_node, a_branch, &localVars);

  // Find partition
  ChoosePartition(&localVars, ON_RTree_MIN_NODE_COUNT);

  // Put branches from buffer into 2 nodes according to chosen partition
  *a_newNode = m_mem_pool.AllocNode();
  (*a_newNode)->m_level = a_node->m_level = level; // restore m_level
  LoadNodes(a_node, *a_newNode, &localVars);
}